

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

void __thiscall LogToCallbackRedirector::~LogToCallbackRedirector(LogToCallbackRedirector *this)

{
  long *plVar1;
  undefined8 *puVar2;
  
  (this->super_LogStream)._vptr_LogStream = (_func_int **)&PTR__LogToCallbackRedirector_008c7f68;
  if ((undefined8 **)Assimp::gPredefinedStreams_abi_cxx11_ != &Assimp::gPredefinedStreams_abi_cxx11_
     ) {
    plVar1 = (long *)(this->stream).user;
    puVar2 = Assimp::gPredefinedStreams_abi_cxx11_;
    do {
      if ((long *)puVar2[2] == plVar1) {
        if (plVar1 != (long *)0x0) {
          (**(code **)(*(long *)puVar2[2] + 8))();
        }
        _DAT_0099ae28 = _DAT_0099ae28 + -1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(puVar2,0x18);
        return;
      }
      puVar2 = (undefined8 *)*puVar2;
    } while ((undefined8 **)puVar2 != &Assimp::gPredefinedStreams_abi_cxx11_);
  }
  return;
}

Assistant:

~LogToCallbackRedirector()  {
#ifndef ASSIMP_BUILD_SINGLETHREADED
        std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
        // (HACK) Check whether the 'stream.user' pointer points to a
        // custom LogStream allocated by #aiGetPredefinedLogStream.
        // In this case, we need to delete it, too. Of course, this
        // might cause strange problems, but the chance is quite low.

        PredefLogStreamMap::iterator it = std::find(gPredefinedStreams.begin(),
            gPredefinedStreams.end(), (Assimp::LogStream*)stream.user);

        if (it != gPredefinedStreams.end()) {
            delete *it;
            gPredefinedStreams.erase(it);
        }
    }